

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall
LLVMBC::ShuffleVectorInst::ShuffleVectorInst
          (ShuffleVectorInst *this,Type *type,Value *a,Value *b,Value *shuf)

{
  initializer_list<LLVMBC::Value_*> __l;
  uint uVar1;
  uint uVar2;
  Constant *pCVar3;
  APInt *this_00;
  int64_t iVar4;
  value_type_conflict3 local_80;
  uint local_7c;
  ConstantDataVector *pCStack_78;
  uint i;
  ConstantDataVector *masks;
  Value *local_68;
  Value *local_60;
  iterator local_58;
  undefined8 local_50;
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> local_48;
  Value *local_30;
  Value *shuf_local;
  Value *b_local;
  Value *a_local;
  Type *type_local;
  ShuffleVectorInst *this_local;
  
  local_30 = shuf;
  shuf_local = b;
  b_local = a;
  a_local = (Value *)type;
  type_local = (Type *)this;
  Instruction::Instruction(&this->super_Instruction,type,ShuffleVector);
  std::vector<int,_dxil_spv::ThreadLocalAllocator<int>_>::vector(&this->shuffle_mask);
  local_68 = b_local;
  local_60 = shuf_local;
  local_58 = &local_68;
  local_50 = 2;
  __l._M_len = 2;
  __l._M_array = local_58;
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::vector
            (&local_48,__l,(allocator_type *)((long)&masks + 7));
  Instruction::set_operands(&this->super_Instruction,&local_48);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::~vector(&local_48)
  ;
  pCStack_78 = cast<LLVMBC::ConstantDataVector>(local_30);
  uVar1 = ConstantDataVector::getNumElements(pCStack_78);
  std::vector<int,_dxil_spv::ThreadLocalAllocator<int>_>::reserve(&this->shuffle_mask,(ulong)uVar1);
  local_7c = 0;
  while( true ) {
    uVar1 = local_7c;
    uVar2 = ConstantDataVector::getNumElements(pCStack_78);
    if (uVar2 <= uVar1) break;
    pCVar3 = ConstantDataVector::getElementAsConstant(pCStack_78,local_7c);
    pCVar3 = &cast<LLVMBC::ConstantInt>(&pCVar3->super_Value)->super_Constant;
    this_00 = Constant::getUniqueInteger(pCVar3);
    iVar4 = APInt::getSExtValue(this_00);
    local_80 = (value_type_conflict3)iVar4;
    std::vector<int,_dxil_spv::ThreadLocalAllocator<int>_>::push_back(&this->shuffle_mask,&local_80)
    ;
    local_7c = local_7c + 1;
  }
  return;
}

Assistant:

ShuffleVectorInst::ShuffleVectorInst(Type *type, Value *a, Value *b, Value *shuf)
	: Instruction(type, ValueKind::ShuffleVector)
{
	set_operands({ a, b });
	auto *masks = cast<ConstantDataVector>(shuf);
	shuffle_mask.reserve(masks->getNumElements());
	for (unsigned i = 0; i < masks->getNumElements(); i++)
		shuffle_mask.push_back(cast<ConstantInt>(masks->getElementAsConstant(i))->getUniqueInteger().getSExtValue());
}